

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::Max::backward_impl
          (Max *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  float *pfVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ushort uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  int iVar32;
  int iVar33;
  Tensor t;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  ulong uStack_30;
  uint uStack_28;
  void *pvStack_20;
  undefined1 auStack_18 [16];
  pointer local_8;
  
  if (1 < i) {
    __assert_fail("i < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,0x17d,
                  "virtual void cnn::Max::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  uStack_30 = *(ulong *)((dEdxi->d).d + 6);
  pvStack_20 = (this->super_Node).aux_mem;
  iVar33 = 1;
  local_48 = *(undefined8 *)(dEdxi->d).d;
  uStack_40 = *(undefined8 *)((dEdxi->d).d + 2);
  uStack_38 = *(undefined8 *)((dEdxi->d).d + 4);
  uStack_28 = (dEdxi->d).bd;
  auStack_18 = (undefined1  [16])0x0;
  local_8 = (pointer)0x0;
  iVar32 = 1;
  uVar12 = uStack_30 >> 0x20;
  if (i == 0) {
    if (uVar12 != 0) {
      auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar13 = 0;
      auVar22 = vpbroadcastq_avx512f();
      do {
        auVar23 = vpbroadcastq_avx512f();
        auVar24 = vmovdqa64_avx512f(auVar19);
        auVar19 = vporq_avx512f(auVar23,auVar20);
        auVar23 = vporq_avx512f(auVar23,auVar21);
        uVar6 = vpcmpuq_avx512f(auVar23,auVar22,2);
        bVar7 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar19,auVar22,2);
        bVar8 = (byte)uVar6;
        uVar17 = CONCAT11(bVar8,bVar7);
        auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)&local_48 + uVar13 * 4));
        auVar19._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar23._4_4_;
        auVar19._0_4_ = (uint)(bVar7 & 1) * auVar23._0_4_;
        auVar19._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar23._8_4_;
        auVar19._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar23._12_4_;
        auVar19._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar23._16_4_;
        auVar19._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar23._20_4_;
        auVar19._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar23._24_4_;
        auVar19._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar23._28_4_;
        auVar19._32_4_ = (uint)(bVar8 & 1) * auVar23._32_4_;
        auVar19._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar23._36_4_;
        auVar19._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar23._40_4_;
        auVar19._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar23._44_4_;
        auVar19._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar23._48_4_;
        auVar19._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar23._52_4_;
        auVar19._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar23._56_4_;
        auVar19._60_4_ = (uint)(bVar8 >> 7) * auVar23._60_4_;
        uVar13 = uVar13 + 0x10;
        auVar19 = vpmulld_avx512f(auVar19,auVar24);
      } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
      auVar19 = vmovdqa32_avx512f(auVar19);
      auVar20._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar24._0_4_;
      bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar20._4_4_ = (uint)bVar3 * auVar19._4_4_ | (uint)!bVar3 * auVar24._4_4_;
      bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar20._8_4_ = (uint)bVar3 * auVar19._8_4_ | (uint)!bVar3 * auVar24._8_4_;
      bVar3 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar20._12_4_ = (uint)bVar3 * auVar19._12_4_ | (uint)!bVar3 * auVar24._12_4_;
      bVar3 = (bool)((byte)(uVar17 >> 4) & 1);
      auVar20._16_4_ = (uint)bVar3 * auVar19._16_4_ | (uint)!bVar3 * auVar24._16_4_;
      bVar3 = (bool)((byte)(uVar17 >> 5) & 1);
      auVar20._20_4_ = (uint)bVar3 * auVar19._20_4_ | (uint)!bVar3 * auVar24._20_4_;
      bVar3 = (bool)((byte)(uVar17 >> 6) & 1);
      auVar20._24_4_ = (uint)bVar3 * auVar19._24_4_ | (uint)!bVar3 * auVar24._24_4_;
      bVar3 = (bool)((byte)(uVar17 >> 7) & 1);
      auVar20._28_4_ = (uint)bVar3 * auVar19._28_4_ | (uint)!bVar3 * auVar24._28_4_;
      auVar20._32_4_ =
           (uint)(bVar8 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar24._32_4_;
      bVar3 = (bool)(bVar8 >> 1 & 1);
      auVar20._36_4_ = (uint)bVar3 * auVar19._36_4_ | (uint)!bVar3 * auVar24._36_4_;
      bVar3 = (bool)(bVar8 >> 2 & 1);
      auVar20._40_4_ = (uint)bVar3 * auVar19._40_4_ | (uint)!bVar3 * auVar24._40_4_;
      bVar3 = (bool)(bVar8 >> 3 & 1);
      auVar20._44_4_ = (uint)bVar3 * auVar19._44_4_ | (uint)!bVar3 * auVar24._44_4_;
      bVar3 = (bool)(bVar8 >> 4 & 1);
      auVar20._48_4_ = (uint)bVar3 * auVar19._48_4_ | (uint)!bVar3 * auVar24._48_4_;
      bVar3 = (bool)(bVar8 >> 5 & 1);
      auVar20._52_4_ = (uint)bVar3 * auVar19._52_4_ | (uint)!bVar3 * auVar24._52_4_;
      bVar3 = (bool)(bVar8 >> 6 & 1);
      auVar20._56_4_ = (uint)bVar3 * auVar19._56_4_ | (uint)!bVar3 * auVar24._56_4_;
      auVar20._60_4_ =
           (uint)(bVar8 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar24._60_4_;
      auVar18 = vextracti64x4_avx512f(auVar20,1);
      auVar19 = vpmulld_avx512f(auVar20,ZEXT3264(auVar18));
      auVar4 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(auVar4,0x55);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      iVar32 = auVar4._0_4_;
    }
    uVar12 = (ulong)(dEdf->d).nd;
    if (uVar12 != 0) {
      auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar22 = vpbroadcastq_avx512f();
      uVar13 = 0;
      do {
        auVar23 = vpbroadcastq_avx512f();
        auVar24 = vmovdqa64_avx512f(auVar19);
        auVar19 = vporq_avx512f(auVar23,auVar20);
        auVar23 = vporq_avx512f(auVar23,auVar21);
        uVar6 = vpcmpuq_avx512f(auVar23,auVar22,2);
        bVar7 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar19,auVar22,2);
        bVar8 = (byte)uVar6;
        uVar17 = CONCAT11(bVar8,bVar7);
        auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar13));
        auVar23._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar19._4_4_;
        auVar23._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
        auVar23._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar19._8_4_;
        auVar23._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar19._12_4_;
        auVar23._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar19._16_4_;
        auVar23._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar19._20_4_;
        auVar23._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar19._24_4_;
        auVar23._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar19._28_4_;
        auVar23._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
        auVar23._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
        auVar23._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
        auVar23._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
        auVar23._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
        auVar23._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
        auVar23._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
        auVar23._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
        uVar13 = uVar13 + 0x10;
        auVar19 = vpmulld_avx512f(auVar23,auVar24);
      } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
      auVar19 = vmovdqa32_avx512f(auVar19);
      auVar21._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar24._0_4_;
      bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar21._4_4_ = (uint)bVar3 * auVar19._4_4_ | (uint)!bVar3 * auVar24._4_4_;
      bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar21._8_4_ = (uint)bVar3 * auVar19._8_4_ | (uint)!bVar3 * auVar24._8_4_;
      bVar3 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar21._12_4_ = (uint)bVar3 * auVar19._12_4_ | (uint)!bVar3 * auVar24._12_4_;
      bVar3 = (bool)((byte)(uVar17 >> 4) & 1);
      auVar21._16_4_ = (uint)bVar3 * auVar19._16_4_ | (uint)!bVar3 * auVar24._16_4_;
      bVar3 = (bool)((byte)(uVar17 >> 5) & 1);
      auVar21._20_4_ = (uint)bVar3 * auVar19._20_4_ | (uint)!bVar3 * auVar24._20_4_;
      bVar3 = (bool)((byte)(uVar17 >> 6) & 1);
      auVar21._24_4_ = (uint)bVar3 * auVar19._24_4_ | (uint)!bVar3 * auVar24._24_4_;
      bVar3 = (bool)((byte)(uVar17 >> 7) & 1);
      auVar21._28_4_ = (uint)bVar3 * auVar19._28_4_ | (uint)!bVar3 * auVar24._28_4_;
      auVar21._32_4_ =
           (uint)(bVar8 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar24._32_4_;
      bVar3 = (bool)(bVar8 >> 1 & 1);
      auVar21._36_4_ = (uint)bVar3 * auVar19._36_4_ | (uint)!bVar3 * auVar24._36_4_;
      bVar3 = (bool)(bVar8 >> 2 & 1);
      auVar21._40_4_ = (uint)bVar3 * auVar19._40_4_ | (uint)!bVar3 * auVar24._40_4_;
      bVar3 = (bool)(bVar8 >> 3 & 1);
      auVar21._44_4_ = (uint)bVar3 * auVar19._44_4_ | (uint)!bVar3 * auVar24._44_4_;
      bVar3 = (bool)(bVar8 >> 4 & 1);
      auVar21._48_4_ = (uint)bVar3 * auVar19._48_4_ | (uint)!bVar3 * auVar24._48_4_;
      bVar3 = (bool)(bVar8 >> 5 & 1);
      auVar21._52_4_ = (uint)bVar3 * auVar19._52_4_ | (uint)!bVar3 * auVar24._52_4_;
      bVar3 = (bool)(bVar8 >> 6 & 1);
      auVar21._56_4_ = (uint)bVar3 * auVar19._56_4_ | (uint)!bVar3 * auVar24._56_4_;
      auVar21._60_4_ =
           (uint)(bVar8 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar24._60_4_;
      auVar18 = vextracti64x4_avx512f(auVar21,1);
      auVar19 = vpmulld_avx512f(auVar21,ZEXT3264(auVar18));
      auVar4 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(auVar4,0x55);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      iVar33 = auVar4._0_4_;
    }
    if (iVar32 * uStack_28 != iVar33 * (dEdf->d).bd) {
      pcVar9 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
      ;
      goto LAB_001a2ab9;
    }
    uVar12 = (ulong)(dEdxi->d).nd;
    if (uVar12 == 0) {
      iVar33 = 1;
    }
    else {
      auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar22 = vpbroadcastq_avx512f();
      uVar13 = 0;
      do {
        auVar23 = vpbroadcastq_avx512f();
        auVar24 = vmovdqa64_avx512f(auVar19);
        auVar19 = vporq_avx512f(auVar23,auVar20);
        auVar23 = vporq_avx512f(auVar23,auVar21);
        uVar6 = vpcmpuq_avx512f(auVar23,auVar22,2);
        bVar7 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar19,auVar22,2);
        bVar8 = (byte)uVar6;
        uVar17 = CONCAT11(bVar8,bVar7);
        auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar13));
        auVar31._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar19._4_4_;
        auVar31._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
        auVar31._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar19._8_4_;
        auVar31._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar19._12_4_;
        auVar31._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar19._16_4_;
        auVar31._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar19._20_4_;
        auVar31._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar19._24_4_;
        auVar31._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar19._28_4_;
        auVar31._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
        auVar31._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
        auVar31._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
        auVar31._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
        auVar31._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
        auVar31._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
        auVar31._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
        auVar31._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
        uVar13 = uVar13 + 0x10;
        auVar19 = vpmulld_avx512f(auVar31,auVar24);
      } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
      auVar19 = vmovdqa32_avx512f(auVar19);
      auVar22._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar24._0_4_;
      bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar22._4_4_ = (uint)bVar3 * auVar19._4_4_ | (uint)!bVar3 * auVar24._4_4_;
      bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar22._8_4_ = (uint)bVar3 * auVar19._8_4_ | (uint)!bVar3 * auVar24._8_4_;
      bVar3 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar22._12_4_ = (uint)bVar3 * auVar19._12_4_ | (uint)!bVar3 * auVar24._12_4_;
      bVar3 = (bool)((byte)(uVar17 >> 4) & 1);
      auVar22._16_4_ = (uint)bVar3 * auVar19._16_4_ | (uint)!bVar3 * auVar24._16_4_;
      bVar3 = (bool)((byte)(uVar17 >> 5) & 1);
      auVar22._20_4_ = (uint)bVar3 * auVar19._20_4_ | (uint)!bVar3 * auVar24._20_4_;
      bVar3 = (bool)((byte)(uVar17 >> 6) & 1);
      auVar22._24_4_ = (uint)bVar3 * auVar19._24_4_ | (uint)!bVar3 * auVar24._24_4_;
      bVar3 = (bool)((byte)(uVar17 >> 7) & 1);
      auVar22._28_4_ = (uint)bVar3 * auVar19._28_4_ | (uint)!bVar3 * auVar24._28_4_;
      auVar22._32_4_ =
           (uint)(bVar8 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar24._32_4_;
      bVar3 = (bool)(bVar8 >> 1 & 1);
      auVar22._36_4_ = (uint)bVar3 * auVar19._36_4_ | (uint)!bVar3 * auVar24._36_4_;
      bVar3 = (bool)(bVar8 >> 2 & 1);
      auVar22._40_4_ = (uint)bVar3 * auVar19._40_4_ | (uint)!bVar3 * auVar24._40_4_;
      bVar3 = (bool)(bVar8 >> 3 & 1);
      auVar22._44_4_ = (uint)bVar3 * auVar19._44_4_ | (uint)!bVar3 * auVar24._44_4_;
      bVar3 = (bool)(bVar8 >> 4 & 1);
      auVar22._48_4_ = (uint)bVar3 * auVar19._48_4_ | (uint)!bVar3 * auVar24._48_4_;
      bVar3 = (bool)(bVar8 >> 5 & 1);
      auVar22._52_4_ = (uint)bVar3 * auVar19._52_4_ | (uint)!bVar3 * auVar24._52_4_;
      bVar3 = (bool)(bVar8 >> 6 & 1);
      auVar22._56_4_ = (uint)bVar3 * auVar19._56_4_ | (uint)!bVar3 * auVar24._56_4_;
      auVar22._60_4_ =
           (uint)(bVar8 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar24._60_4_;
      auVar18 = vextracti64x4_avx512f(auVar22,1);
      auVar19 = vpmulld_avx512f(auVar22,ZEXT3264(auVar18));
      auVar4 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(auVar4,0x55);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      iVar33 = auVar4._0_4_;
    }
    uVar11 = iVar33 * (dEdxi->d).bd;
    uVar12 = (ulong)uVar11;
    if (uVar11 != iVar32 * uStack_28) {
      pcVar9 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
      ;
      goto LAB_001a2adb;
    }
    pfVar1 = dEdxi->v;
    uVar13 = uVar12;
    if ((((ulong)pfVar1 & 3) == 0) &&
       (uVar13 = (ulong)(-((uint)((ulong)pfVar1 >> 2) & 0x3fffffff) & 0xf), uVar12 <= uVar13)) {
      uVar13 = uVar12;
    }
    pfVar2 = dEdf->v;
    uVar15 = uVar12 - uVar13;
    uVar14 = uVar15 + 0xf;
    if (-1 < (long)uVar15) {
      uVar14 = uVar15;
    }
    if (uVar13 != 0) {
      uVar16 = 0;
      do {
        auVar4 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[uVar16]),
                                 ZEXT416(*(uint *)((long)pvStack_20 + uVar16 * 4)),
                                 ZEXT416((uint)pfVar1[uVar16]));
        pfVar1[uVar16] = auVar4._0_4_;
        uVar16 = uVar16 + 1;
      } while (uVar13 != uVar16);
    }
    uVar14 = (uVar14 & 0xfffffffffffffff0) + uVar13;
    if (0xf < (long)uVar15) {
      do {
        auVar19 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar2 + uVar13),
                                      *(undefined1 (*) [64])((long)pvStack_20 + uVar13 * 4),
                                      *(undefined1 (*) [64])(pfVar1 + uVar13));
        *(undefined1 (*) [64])(pfVar1 + uVar13) = auVar19;
        uVar13 = uVar13 + 0x10;
      } while ((long)uVar13 < (long)uVar14);
    }
    if ((long)uVar14 < (long)uVar12) {
      do {
        auVar4 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[uVar14]),
                                 ZEXT416(*(uint *)((long)pvStack_20 + uVar14 * 4)),
                                 ZEXT416((uint)pfVar1[uVar14]));
        pfVar1[uVar14] = auVar4._0_4_;
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
  }
  else {
    if (uVar12 != 0) {
      auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar13 = 0;
      auVar22 = vpbroadcastq_avx512f();
      do {
        auVar23 = vpbroadcastq_avx512f();
        auVar24 = vmovdqa64_avx512f(auVar19);
        auVar19 = vporq_avx512f(auVar23,auVar20);
        auVar23 = vporq_avx512f(auVar23,auVar21);
        uVar6 = vpcmpuq_avx512f(auVar23,auVar22,2);
        bVar7 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar19,auVar22,2);
        bVar8 = (byte)uVar6;
        uVar17 = CONCAT11(bVar8,bVar7);
        auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)&local_48 + uVar13 * 4));
        auVar25._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar19._4_4_;
        auVar25._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
        auVar25._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar19._8_4_;
        auVar25._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar19._12_4_;
        auVar25._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar19._16_4_;
        auVar25._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar19._20_4_;
        auVar25._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar19._24_4_;
        auVar25._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar19._28_4_;
        auVar25._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
        auVar25._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
        auVar25._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
        auVar25._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
        auVar25._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
        auVar25._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
        auVar25._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
        auVar25._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
        uVar13 = uVar13 + 0x10;
        auVar19 = vpmulld_avx512f(auVar25,auVar24);
      } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
      auVar19 = vmovdqa32_avx512f(auVar19);
      auVar26._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar24._0_4_;
      bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar3 * auVar19._4_4_ | (uint)!bVar3 * auVar24._4_4_;
      bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar3 * auVar19._8_4_ | (uint)!bVar3 * auVar24._8_4_;
      bVar3 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar3 * auVar19._12_4_ | (uint)!bVar3 * auVar24._12_4_;
      bVar3 = (bool)((byte)(uVar17 >> 4) & 1);
      auVar26._16_4_ = (uint)bVar3 * auVar19._16_4_ | (uint)!bVar3 * auVar24._16_4_;
      bVar3 = (bool)((byte)(uVar17 >> 5) & 1);
      auVar26._20_4_ = (uint)bVar3 * auVar19._20_4_ | (uint)!bVar3 * auVar24._20_4_;
      bVar3 = (bool)((byte)(uVar17 >> 6) & 1);
      auVar26._24_4_ = (uint)bVar3 * auVar19._24_4_ | (uint)!bVar3 * auVar24._24_4_;
      bVar3 = (bool)((byte)(uVar17 >> 7) & 1);
      auVar26._28_4_ = (uint)bVar3 * auVar19._28_4_ | (uint)!bVar3 * auVar24._28_4_;
      auVar26._32_4_ =
           (uint)(bVar8 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar24._32_4_;
      bVar3 = (bool)(bVar8 >> 1 & 1);
      auVar26._36_4_ = (uint)bVar3 * auVar19._36_4_ | (uint)!bVar3 * auVar24._36_4_;
      bVar3 = (bool)(bVar8 >> 2 & 1);
      auVar26._40_4_ = (uint)bVar3 * auVar19._40_4_ | (uint)!bVar3 * auVar24._40_4_;
      bVar3 = (bool)(bVar8 >> 3 & 1);
      auVar26._44_4_ = (uint)bVar3 * auVar19._44_4_ | (uint)!bVar3 * auVar24._44_4_;
      bVar3 = (bool)(bVar8 >> 4 & 1);
      auVar26._48_4_ = (uint)bVar3 * auVar19._48_4_ | (uint)!bVar3 * auVar24._48_4_;
      bVar3 = (bool)(bVar8 >> 5 & 1);
      auVar26._52_4_ = (uint)bVar3 * auVar19._52_4_ | (uint)!bVar3 * auVar24._52_4_;
      bVar3 = (bool)(bVar8 >> 6 & 1);
      auVar26._56_4_ = (uint)bVar3 * auVar19._56_4_ | (uint)!bVar3 * auVar24._56_4_;
      auVar26._60_4_ =
           (uint)(bVar8 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar24._60_4_;
      auVar18 = vextracti64x4_avx512f(auVar26,1);
      auVar19 = vpmulld_avx512f(auVar26,ZEXT3264(auVar18));
      auVar4 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(auVar4,0x55);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      iVar32 = auVar4._0_4_;
    }
    uVar11 = iVar32 * uStack_28;
    uVar12 = (ulong)(dEdf->d).nd;
    if (uVar12 != 0) {
      auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar22 = vpbroadcastq_avx512f();
      uVar13 = 0;
      do {
        auVar23 = vpbroadcastq_avx512f();
        auVar24 = vmovdqa64_avx512f(auVar19);
        auVar19 = vporq_avx512f(auVar23,auVar20);
        auVar23 = vporq_avx512f(auVar23,auVar21);
        uVar6 = vpcmpuq_avx512f(auVar23,auVar22,2);
        bVar7 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar19,auVar22,2);
        bVar8 = (byte)uVar6;
        uVar17 = CONCAT11(bVar8,bVar7);
        auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar13));
        auVar27._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar19._4_4_;
        auVar27._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
        auVar27._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar19._8_4_;
        auVar27._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar19._12_4_;
        auVar27._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar19._16_4_;
        auVar27._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar19._20_4_;
        auVar27._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar19._24_4_;
        auVar27._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar19._28_4_;
        auVar27._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
        auVar27._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
        auVar27._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
        auVar27._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
        auVar27._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
        auVar27._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
        auVar27._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
        auVar27._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
        uVar13 = uVar13 + 0x10;
        auVar19 = vpmulld_avx512f(auVar27,auVar24);
      } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
      auVar19 = vmovdqa32_avx512f(auVar19);
      auVar28._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar24._0_4_;
      bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar28._4_4_ = (uint)bVar3 * auVar19._4_4_ | (uint)!bVar3 * auVar24._4_4_;
      bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar28._8_4_ = (uint)bVar3 * auVar19._8_4_ | (uint)!bVar3 * auVar24._8_4_;
      bVar3 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar28._12_4_ = (uint)bVar3 * auVar19._12_4_ | (uint)!bVar3 * auVar24._12_4_;
      bVar3 = (bool)((byte)(uVar17 >> 4) & 1);
      auVar28._16_4_ = (uint)bVar3 * auVar19._16_4_ | (uint)!bVar3 * auVar24._16_4_;
      bVar3 = (bool)((byte)(uVar17 >> 5) & 1);
      auVar28._20_4_ = (uint)bVar3 * auVar19._20_4_ | (uint)!bVar3 * auVar24._20_4_;
      bVar3 = (bool)((byte)(uVar17 >> 6) & 1);
      auVar28._24_4_ = (uint)bVar3 * auVar19._24_4_ | (uint)!bVar3 * auVar24._24_4_;
      bVar3 = (bool)((byte)(uVar17 >> 7) & 1);
      auVar28._28_4_ = (uint)bVar3 * auVar19._28_4_ | (uint)!bVar3 * auVar24._28_4_;
      auVar28._32_4_ =
           (uint)(bVar8 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar24._32_4_;
      bVar3 = (bool)(bVar8 >> 1 & 1);
      auVar28._36_4_ = (uint)bVar3 * auVar19._36_4_ | (uint)!bVar3 * auVar24._36_4_;
      bVar3 = (bool)(bVar8 >> 2 & 1);
      auVar28._40_4_ = (uint)bVar3 * auVar19._40_4_ | (uint)!bVar3 * auVar24._40_4_;
      bVar3 = (bool)(bVar8 >> 3 & 1);
      auVar28._44_4_ = (uint)bVar3 * auVar19._44_4_ | (uint)!bVar3 * auVar24._44_4_;
      bVar3 = (bool)(bVar8 >> 4 & 1);
      auVar28._48_4_ = (uint)bVar3 * auVar19._48_4_ | (uint)!bVar3 * auVar24._48_4_;
      bVar3 = (bool)(bVar8 >> 5 & 1);
      auVar28._52_4_ = (uint)bVar3 * auVar19._52_4_ | (uint)!bVar3 * auVar24._52_4_;
      bVar3 = (bool)(bVar8 >> 6 & 1);
      auVar28._56_4_ = (uint)bVar3 * auVar19._56_4_ | (uint)!bVar3 * auVar24._56_4_;
      auVar28._60_4_ =
           (uint)(bVar8 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar24._60_4_;
      auVar18 = vextracti64x4_avx512f(auVar28,1);
      auVar19 = vpmulld_avx512f(auVar28,ZEXT3264(auVar18));
      auVar4 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(auVar4,0x55);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      iVar33 = auVar4._0_4_;
    }
    if (uVar11 != iVar33 * (dEdf->d).bd) {
      pcVar9 = 
      "Eigen::CwiseBinaryOp<cnn::FMaxBackwardInv, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::FMaxBackwardInv, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
      ;
LAB_001a2ab9:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar9);
    }
    uVar12 = (ulong)(dEdxi->d).nd;
    if (uVar12 == 0) {
      iVar32 = 1;
    }
    else {
      auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar22 = vpbroadcastq_avx512f();
      uVar13 = 0;
      do {
        auVar23 = vpbroadcastq_avx512f();
        auVar24 = vmovdqa64_avx512f(auVar19);
        auVar19 = vporq_avx512f(auVar23,auVar20);
        auVar23 = vporq_avx512f(auVar23,auVar21);
        uVar6 = vpcmpuq_avx512f(auVar23,auVar22,2);
        bVar7 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar19,auVar22,2);
        bVar8 = (byte)uVar6;
        uVar17 = CONCAT11(bVar8,bVar7);
        auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar13));
        auVar29._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar19._4_4_;
        auVar29._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
        auVar29._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar19._8_4_;
        auVar29._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar19._12_4_;
        auVar29._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar19._16_4_;
        auVar29._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar19._20_4_;
        auVar29._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar19._24_4_;
        auVar29._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar19._28_4_;
        auVar29._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
        auVar29._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
        auVar29._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
        auVar29._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
        auVar29._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
        auVar29._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
        auVar29._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
        auVar29._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
        uVar13 = uVar13 + 0x10;
        auVar19 = vpmulld_avx512f(auVar29,auVar24);
      } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
      auVar19 = vmovdqa32_avx512f(auVar19);
      auVar30._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar24._0_4_;
      bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar30._4_4_ = (uint)bVar3 * auVar19._4_4_ | (uint)!bVar3 * auVar24._4_4_;
      bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar30._8_4_ = (uint)bVar3 * auVar19._8_4_ | (uint)!bVar3 * auVar24._8_4_;
      bVar3 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar30._12_4_ = (uint)bVar3 * auVar19._12_4_ | (uint)!bVar3 * auVar24._12_4_;
      bVar3 = (bool)((byte)(uVar17 >> 4) & 1);
      auVar30._16_4_ = (uint)bVar3 * auVar19._16_4_ | (uint)!bVar3 * auVar24._16_4_;
      bVar3 = (bool)((byte)(uVar17 >> 5) & 1);
      auVar30._20_4_ = (uint)bVar3 * auVar19._20_4_ | (uint)!bVar3 * auVar24._20_4_;
      bVar3 = (bool)((byte)(uVar17 >> 6) & 1);
      auVar30._24_4_ = (uint)bVar3 * auVar19._24_4_ | (uint)!bVar3 * auVar24._24_4_;
      bVar3 = (bool)((byte)(uVar17 >> 7) & 1);
      auVar30._28_4_ = (uint)bVar3 * auVar19._28_4_ | (uint)!bVar3 * auVar24._28_4_;
      auVar30._32_4_ =
           (uint)(bVar8 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar24._32_4_;
      bVar3 = (bool)(bVar8 >> 1 & 1);
      auVar30._36_4_ = (uint)bVar3 * auVar19._36_4_ | (uint)!bVar3 * auVar24._36_4_;
      bVar3 = (bool)(bVar8 >> 2 & 1);
      auVar30._40_4_ = (uint)bVar3 * auVar19._40_4_ | (uint)!bVar3 * auVar24._40_4_;
      bVar3 = (bool)(bVar8 >> 3 & 1);
      auVar30._44_4_ = (uint)bVar3 * auVar19._44_4_ | (uint)!bVar3 * auVar24._44_4_;
      bVar3 = (bool)(bVar8 >> 4 & 1);
      auVar30._48_4_ = (uint)bVar3 * auVar19._48_4_ | (uint)!bVar3 * auVar24._48_4_;
      bVar3 = (bool)(bVar8 >> 5 & 1);
      auVar30._52_4_ = (uint)bVar3 * auVar19._52_4_ | (uint)!bVar3 * auVar24._52_4_;
      bVar3 = (bool)(bVar8 >> 6 & 1);
      auVar30._56_4_ = (uint)bVar3 * auVar19._56_4_ | (uint)!bVar3 * auVar24._56_4_;
      auVar30._60_4_ =
           (uint)(bVar8 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar24._60_4_;
      auVar18 = vextracti64x4_avx512f(auVar30,1);
      auVar19 = vpmulld_avx512f(auVar30,ZEXT3264(auVar18));
      auVar4 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(auVar4,0x55);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      iVar32 = auVar4._0_4_;
    }
    uVar10 = iVar32 * (dEdxi->d).bd;
    if (uVar10 != uVar11) {
      pcVar9 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<cnn::FMaxBackwardInv, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
      ;
LAB_001a2adb:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar9);
    }
    if (uVar11 != 0) {
      pfVar1 = dEdf->v;
      pfVar2 = dEdxi->v;
      uVar12 = 0;
      do {
        auVar4 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - *(float *)((long)pvStack_20 + uVar12 * 4))),
                                 ZEXT416((uint)pfVar1[uVar12]),ZEXT416((uint)pfVar2[uVar12]));
        pfVar2[uVar12] = auVar4._0_4_;
        uVar12 = uVar12 + 1;
      } while (uVar10 != uVar12);
    }
  }
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector
            ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)auStack_18);
  return;
}

Assistant:

void Max::backward_impl(const vector<const Tensor*>& xs,
                   const Tensor& fx,
                   const Tensor& dEdf,
                   unsigned i,
                   Tensor& dEdxi) const {
  assert(i < 2);
#ifdef HAVE_CUDA
  throw std::runtime_error("Max not yet implemented for CUDA");
#else
  const Tensor t(dEdxi.d, static_cast<float*>(aux_mem));
  if (i == 0) {
    dEdxi.vec() += t.vec().cwiseProduct(dEdf.vec());
  } else {
    dEdxi.vec() += t.vec().binaryExpr(dEdf.vec(), FMaxBackwardInv());
  }
#endif
}